

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void dash_traverse_func(void *closure,plutovg_path_command_t command,plutovg_point_t *points,
                       int npoints)

{
  int iVar1;
  undefined4 in_register_0000000c;
  float fVar2;
  float fVar3;
  float fVar4;
  plutovg_point_t p1;
  plutovg_point_t p;
  plutovg_point_t local_38;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  
  if (command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
    if (*(char *)((long)closure + 0x1c) == '\x01') {
      (**(code **)((long)closure + 0x28))
                (*(undefined8 *)((long)closure + 0x30),0,points,
                 CONCAT44(in_register_0000000c,npoints));
    }
    *(plutovg_point_t *)((long)closure + 0x20) = *points;
    *(undefined4 *)((long)closure + 0x10) = *(undefined4 *)((long)closure + 0xc);
    *(undefined4 *)((long)closure + 0x18) = *(undefined4 *)((long)closure + 0x14);
    *(undefined1 *)((long)closure + 0x1d) = *(undefined1 *)((long)closure + 0x1c);
  }
  else {
    if ((command & ~PLUTOVG_PATH_COMMAND_CUBIC_TO) != PLUTOVG_PATH_COMMAND_LINE_TO) {
      __assert_fail("command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-path.c"
                    ,0x22b,
                    "void dash_traverse_func(void *, plutovg_path_command_t, const plutovg_point_t *, int)"
                   );
    }
    local_1c = *(float *)((long)closure + 0x20);
    local_20 = *(float *)((long)closure + 0x24);
    local_38 = *points;
    local_24 = local_38.x - local_1c;
    local_28 = local_38.y - local_20;
    fVar2 = local_24 * local_24 + local_28 * local_28;
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar3 = *(float *)(*closure +
                      (long)(*(int *)((long)closure + 0x18) % *(int *)((long)closure + 8)) * 4) -
            *(float *)((long)closure + 0x10);
    if (fVar3 < fVar2) {
      fVar4 = 0.0;
      local_2c = fVar2;
      do {
        fVar4 = fVar4 + fVar3;
        local_18 = (fVar4 / local_2c) * local_24 + local_1c;
        local_14 = (fVar4 / local_2c) * local_28 + local_20;
        (**(code **)((long)closure + 0x28))
                  (*(undefined8 *)((long)closure + 0x30),*(undefined1 *)((long)closure + 0x1d),
                   &local_18,1);
        *(undefined4 *)((long)closure + 0x10) = 0;
        *(byte *)((long)closure + 0x1d) = *(byte *)((long)closure + 0x1d) ^ 1;
        iVar1 = *(int *)((long)closure + 0x18) + 1;
        *(int *)((long)closure + 0x18) = iVar1;
        fVar2 = local_2c - fVar4;
        fVar3 = *(float *)(*closure + (long)(iVar1 % *(int *)((long)closure + 8)) * 4) -
                *(float *)((long)closure + 0x10);
      } while (fVar3 < fVar2);
    }
    if (*(char *)((long)closure + 0x1d) == '\x01') {
      (**(code **)((long)closure + 0x28))(*(undefined8 *)((long)closure + 0x30),1,&local_38,1);
    }
    *(float *)((long)closure + 0x10) = fVar2 + *(float *)((long)closure + 0x10);
    *(plutovg_point_t *)((long)closure + 0x20) = local_38;
  }
  return;
}

Assistant:

static void dash_traverse_func(void* closure, plutovg_path_command_t command, const plutovg_point_t* points, int npoints)
{
    dasher_t* dasher = (dasher_t*)(closure);
    if(command == PLUTOVG_PATH_COMMAND_MOVE_TO) {
        if(dasher->start_toggle)
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, npoints);
        dasher->current_point = points[0];
        dasher->phase = dasher->start_phase;
        dasher->index = dasher->start_index;
        dasher->toggle = dasher->start_toggle;
        return;
    }

    assert(command == PLUTOVG_PATH_COMMAND_LINE_TO || command == PLUTOVG_PATH_COMMAND_CLOSE);
    plutovg_point_t p0 = dasher->current_point;
    plutovg_point_t p1 = points[0];
    float dx = p1.x - p0.x;
    float dy = p1.y - p0.y;
    float dist0 = sqrtf(dx*dx + dy*dy);
    float dist1 = 0.f;
    while(dist0 - dist1 > dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase) {
        dist1 += dasher->dashes[dasher->index % dasher->ndashes] - dasher->phase;
        float a = dist1 / dist0;
        plutovg_point_t p = { p0.x + a * dx, p0.y + a * dy };
        if(dasher->toggle) {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p, 1);
        } else {
            dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_MOVE_TO, &p, 1);
        }

        dasher->phase = 0.f;
        dasher->toggle = !dasher->toggle;
        dasher->index++;
    }

    if(dasher->toggle) {
        dasher->traverse_func(dasher->closure, PLUTOVG_PATH_COMMAND_LINE_TO, &p1, 1);
    }

    dasher->phase += dist0 - dist1;
    dasher->current_point = p1;
}